

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Addr> *addr,RegMap<std::shared_ptr<Register>_> *mp)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  const_iterator cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
  _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  bool bVar6;
  shared_ptr<mocker::nasm::NumericConstant> sVar7;
  shared_ptr<mocker::nasm::LabelAddr> sVar8;
  shared_ptr<mocker::nasm::Label> sVar9;
  shared_ptr<mocker::nasm::Addr> sVar10;
  shared_ptr<mocker::nasm::Register> reg2;
  shared_ptr<mocker::nasm::Register> p;
  shared_ptr<mocker::nasm::Register> reg1;
  key_type local_88;
  key_type local_70;
  undefined1 local_59;
  key_type local_58;
  MemoryAddr *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  int local_30;
  int local_2c;
  
  sVar7 = dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
                    ((nasm *)&local_70,addr);
  _Var5 = sVar7.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  bVar6 = true;
  if ((__node_type *)
      local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (__node_type *)0x0) {
    sVar8 = dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                      ((nasm *)&local_58,addr);
    _Var5 = sVar8.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    bVar6 = true;
    if ((anon_struct_8_0_00000001_for___align)
        local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (anon_struct_8_0_00000001_for___align)0x0) {
      sVar9 = dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>
                        ((nasm *)&local_88,addr);
      _Var5 = sVar9.super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      bVar6 = (MemoryAddr *)
              local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (MemoryAddr *)0x0;
      if (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var5._M_pi = extraout_RDX;
      }
    }
    if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  if (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (bVar6) {
    *(element_type **)this =
         (addr->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (addr->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    goto LAB_001a067c;
  }
  dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>((nasm *)&local_70,addr);
  if ((__node_type *)
      local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (__node_type *)0x0) {
    if (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>((nasm *)&local_70,addr);
    if ((__node_type *)
        local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (__node_type *)0x0) {
      if (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                    ,0xb3,
                    "std::shared_ptr<Addr> mocker::nasm::replaceRegs(const std::shared_ptr<Addr> &, const RegMap<std::shared_ptr<Register>> &)"
                   );
    }
    local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          &(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
              *)&(local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->identifier)->
           super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
           )._M_storage._M_storage.__align;
    if ((anon_struct_8_0_00000001_for___align)
        local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (anon_struct_8_0_00000001_for___align)0x0) {
      local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001a04aa:
      local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            &(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                *)&(local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->identifier)->
             super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
             )._M_storage._M_storage.__align;
      local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                          *)&(local_70.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->identifier)->
                       super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_storage._M_storage + 8);
    }
    else {
      local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                          *)&(local_70.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->identifier)->
                       super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_storage._M_storage + 8);
      if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
          if ((anon_struct_8_0_00000001_for___align)
              local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (anon_struct_8_0_00000001_for___align)0x0) goto LAB_001a04aa;
        }
        else {
          (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      cVar2 = std::
              _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&mp->_M_h,&local_58);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      }
      else {
        local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)cVar2.
                     super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                     ._M_cur + 0x18);
        local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)cVar2.
                        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                        ._M_cur + 0x20);
      }
    }
    if (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                     *)&(local_70.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->identifier)->
                  super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                  )._M_storage._M_storage + 0x10);
    _Var4._M_cur = (__node_type *)
                   local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    if ((MemoryAddr *)
        local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (MemoryAddr *)0x0) {
      local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48 = (MemoryAddr *)0x0;
LAB_001a05a3:
      a_Stack_40[0]._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&((_Var4._M_cur)->
                    super__Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_storage._M_storage + 0x18);
    }
    else {
      local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                          *)&(local_70.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->identifier)->
                       super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_storage._M_storage + 0x18);
      if (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded != '\0') {
          (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          goto LAB_001a058d;
        }
        LOCK();
        (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        if ((MemoryAddr *)
            local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (MemoryAddr *)0x0) goto LAB_001a058d;
LAB_001a059f:
        local_48 = *(MemoryAddr **)
                    ((long)&((_Var4._M_cur)->
                            super__Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_storage._M_storage + 0x10);
        goto LAB_001a05a3;
      }
LAB_001a058d:
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&mp->_M_h,&local_88);
      if (_Var4._M_cur != (__node_type *)0x0) goto LAB_001a059f;
      local_48 = (MemoryAddr *)
                 local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      a_Stack_40[0]._M_pi =
           local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_40[0]._M_pi)->_M_use_count = (a_Stack_40[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_40[0]._M_pi)->_M_use_count = (a_Stack_40[0]._M_pi)->_M_use_count + 1;
      }
    }
    local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,a_Stack_40);
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = (int)(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                       *)&(local_70.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->identifier)->super__Hash_node_code_cache<true>)._M_hash_code;
    local_30 = *(int *)&(((__node_type *)
                         ((long)local_70.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x30))->super__Hash_node_base)._M_nxt;
    local_48 = (MemoryAddr *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>&,int,int>
              (a_Stack_40,&local_48,(allocator<mocker::nasm::MemoryAddr> *)&local_59,&local_58,
               &local_88,&local_2c,&local_30);
    *(MemoryAddr **)this = local_48;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_40[0]._M_pi;
    _Var5._M_pi = extraout_RDX_03;
    if (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var5._M_pi = extraout_RDX_04;
    }
    if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var5._M_pi = extraout_RDX_05;
    }
  }
  else {
    cVar2 = std::
            _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&mp->_M_h,&local_70);
    _Var3._M_pi = local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                   ._M_cur + 0x18);
      _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)cVar2.
                            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            ._M_cur + 0x20);
    }
    if (_Var3._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var5._M_pi = extraout_RDX_02;
    }
    else {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
      }
    }
    *(element_type **)this =
         local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
  }
  if (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var5._M_pi = extraout_RDX_06;
  }
LAB_001a067c:
  sVar10.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar10.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar10.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> replaceRegs(const std::shared_ptr<Addr> &addr,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  auto getIfExists = [&mp](const std::shared_ptr<Register> &p) {
    auto iter = mp.find(p);
    if (iter == mp.end())
      return p;
    return iter->second;
  };
  if (dyc<NumericConstant>(addr) || dyc<LabelAddr>(addr) || dyc<Label>(addr))
    return addr;
  if (auto p = dyc<Register>(addr))
    return getIfExists(p);
  if (auto p = dyc<MemoryAddr>(addr)) {
    auto reg1 = dyc<Register>(p->getReg1());
    reg1 = reg1 ? getIfExists(reg1) : p->getReg1();
    auto reg2 = dyc<Register>(p->getReg2());
    reg2 = reg2 ? getIfExists(reg2) : p->getReg2();
    return std::make_shared<MemoryAddr>(reg1, reg2, p->getScale(),
                                        p->getNumber());
  }
  assert(false);
}